

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O2

_Bool duckdb_je_bin_init(bin_t *bin,uint binind)

{
  _Bool _Var1;
  
  _Var1 = duckdb_je_malloc_mutex_init(&bin->lock,"bin",WITNESS_RANK_BIN,malloc_mutex_rank_exclusive)
  ;
  if (!_Var1) {
    bin->slabcur = (edata_t *)0x0;
    duckdb_je_edata_heap_new(&bin->slabs_nonfull);
    (bin->slabs_full).head.qlh_first = (edata_t *)0x0;
    (bin->stats).nmalloc = 0;
    (bin->stats).ndalloc = 0;
    (bin->stats).nrequests = 0;
    (bin->stats).curregs = 0;
    (bin->stats).nfills = 0;
    (bin->stats).nflushes = 0;
    (bin->stats).nslabs = 0;
    (bin->stats).reslabs = 0;
    (bin->stats).curslabs = 0;
    (bin->stats).nonfull_slabs = 0;
    (bin->stats).batch_pops = 0;
    (bin->stats).batch_failed_pushes = 0;
    (bin->stats).batch_pushes = 0;
    (bin->stats).batch_pushed_elems = 0;
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      batcher_init((batcher_t *)(bin + 1),duckdb_je_opt_bin_info_remote_free_max);
    }
  }
  return _Var1;
}

Assistant:

bool
bin_init(bin_t *bin, unsigned binind) {
	if (malloc_mutex_init(&bin->lock, "bin", WITNESS_RANK_BIN,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	bin->slabcur = NULL;
	edata_heap_new(&bin->slabs_nonfull);
	edata_list_active_init(&bin->slabs_full);
	if (config_stats) {
		memset(&bin->stats, 0, sizeof(bin_stats_t));
	}
	if (arena_bin_has_batch(binind)) {
		bin_with_batch_t *batched_bin = (bin_with_batch_t *)bin;
		batcher_init(&batched_bin->remote_frees,
		    opt_bin_info_remote_free_max);
	}
	return false;
}